

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  char *pcVar1;
  timeval tVar2;
  __time_t local_68;
  __suseconds_t local_60;
  long local_58;
  ssize_t bytes_written;
  ssize_t len;
  char *eob;
  pingpong *pp;
  SMTP *smtp;
  SessionHandle *data;
  undefined1 local_1d;
  CURLcode result;
  _Bool premature_local;
  connectdata *pcStack_18;
  CURLcode status_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  smtp = (SMTP *)conn->data;
  pp = (pingpong *)(((SessionHandle *)smtp)->req).protop;
  eob = (char *)&conn->proto;
  if ((pp == (pingpong *)0x0) || ((conn->proto).ftpc.pp.conn == (connectdata *)0x0)) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    local_1d = premature;
    result = status;
    pcStack_18 = conn;
    if (status == CURLE_OK) {
      if (((((((SessionHandle *)smtp)->set).connect_only & 1U) == 0) &&
          (((((SessionHandle *)smtp)->set).upload & 1U) != 0)) &&
         ((((SessionHandle *)smtp)->set).mail_rcpt != (curl_slist *)0x0)) {
        len = (ssize_t)anon_var_dwarf_58b56;
        bytes_written = 5;
        if (((pp->pending_resp & 1U) != 0) || ((conn->data->state).infilesize == 0)) {
          len = 0x15edd7;
          bytes_written = 3;
        }
        data._4_4_ = Curl_write(conn,conn->writesockfd,(void *)len,bytes_written,&local_58);
        pcVar1 = eob;
        if (data._4_4_ != CURLE_OK) {
          return data._4_4_;
        }
        if (local_58 == bytes_written) {
          tVar2 = curlx_tvnow();
          local_68 = tVar2.tv_sec;
          *(__time_t *)(pcVar1 + 0x40) = local_68;
          local_60 = tVar2.tv_usec;
          *(__suseconds_t *)(pcVar1 + 0x48) = local_60;
        }
        else {
          pcVar1 = (*Curl_cstrdup)((char *)len);
          *(char **)(eob + 0x28) = pcVar1;
          *(ssize_t *)(eob + 0x38) = bytes_written;
          *(ssize_t *)(eob + 0x30) = bytes_written - local_58;
        }
        state(pcStack_18,SMTP_POSTDATA);
        data._4_4_ = smtp_block_statemach(pcStack_18);
      }
    }
    else {
      (conn->bits).close = true;
      data._4_4_ = status;
    }
    if (pp->cache_size != 0) {
      (*Curl_cfree)((void *)pp->cache_size);
      pp->cache_size = 0;
    }
    *(undefined4 *)&pp->cache = 0;
    conn_local._4_4_ = data._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  struct pingpong *pp = &conn->proto.smtpc.pp;
  const char *eob;
  ssize_t len;
  ssize_t bytes_written;

  (void)premature;

  if(!smtp || !pp->conn)
    /* When the easy handle is removed from the multi interface while libcurl
       is still trying to resolve the host name, the SMTP struct is not yet
       initialized. However, the removal action calls Curl_done() which in
       turn calls this function, so we simply return success. */
    return CURLE_OK;

  if(status) {
    connclose(conn, "SMTP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && data->set.upload && data->set.mail_rcpt) {
    /* Calculate the EOB taking into account any terminating CRLF from the
       previous line of the email or the CRLF of the DATA command when there
       is "no mail data". RFC-5321, sect. 4.1.1.4. */
    eob = SMTP_EOB;
    len = SMTP_EOB_LEN;
    if(smtp->trailing_crlf || !conn->data->state.infilesize) {
      eob += 2;
      len -= 2;
    }

    /* Send the end of block data */
    result = Curl_write(conn, conn->writesockfd, eob, len, &bytes_written);
    if(result)
      return result;

    if(bytes_written != len) {
      /* The whole chunk was not sent so keep it around and adjust the
         pingpong structure accordingly */
      pp->sendthis = strdup(eob);
      pp->sendsize = len;
      pp->sendleft = len - bytes_written;
    }
    else
      /* Successfully sent so adjust the response timeout relative to now */
      pp->response = Curl_tvnow();

    state(conn, SMTP_POSTDATA);

    /* Run the state-machine

       TODO: when the multi interface is used, this _really_ should be using
       the smtp_multi_statemach function but we have no general support for
       non-blocking DONE operations, not in the multi state machine and with
       Curl_done() invokes on several places in the code!
    */
    result = smtp_block_statemach(conn);
  }

  /* Cleanup our per-request based variables */
  Curl_safefree(smtp->custom);

  /* Clear the transfer mode for the next request */
  smtp->transfer = FTPTRANSFER_BODY;

  return result;
}